

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_fmsub_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  wr_t *pwd_00;
  long lVar1;
  long lVar2;
  CPUMIPSState_conflict5 *pCVar3;
  float32 fVar4;
  uint c_00;
  int iVar5;
  int iVar6;
  float_status *pfVar7;
  float64 fVar8;
  uintptr_t unaff_retaddr;
  bool local_89;
  bool local_79;
  int c_1;
  float_status *status_1;
  int c;
  float_status *status;
  uint32_t i;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict5 *env_local;
  
  pwd_00 = (wr_t *)((env->active_fpu).fpr + wd);
  lVar1 = (ulong)ws * 0x10 + 0x338;
  lVar2 = (ulong)wt * 0x10 + 0x338;
  wx.w[2] = wt;
  wx.w[3] = ws;
  wt_local = wd;
  ws_local = df;
  _wd_local = env;
  clear_msacsr_cause(env);
  if (ws_local == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      fVar4 = float32_muladd_mips64
                        (*(float32 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 4 + lVar1 + -0x338),
                         *(float32 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 4 + lVar2 + -0x338),
                         pwd_00->w[status._4_4_],2,pfVar7);
      pCVar3 = _wd_local;
      ((wr_t *)&pwx)->w[status._4_4_] = fVar4;
      iVar5 = float32_is_zero(((wr_t *)&pwx)->w[status._4_4_]);
      local_79 = false;
      if (iVar5 == 0) {
        iVar5 = float32_is_zero_or_denormal(((wr_t *)&pwx)->w[status._4_4_]);
        local_79 = iVar5 != 0;
      }
      c_00 = update_msacsr(pCVar3,0,(uint)local_79);
      iVar5 = get_enabled_exceptions(_wd_local,c_00);
      if (iVar5 != 0) {
        fVar4 = float32_default_nan_mips64(pfVar7);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar4 ^ 0x400020) & 0xffffffc0 | c_00;
      }
    }
  }
  else {
    if (ws_local != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1961,
                    "void helper_msa_fmsub_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      fVar8 = float64_muladd_mips64
                        (*(float64 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 8 + lVar1 + -0x338),
                         *(float64 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 8 + lVar2 + -0x338),
                         pwd_00->d[status._4_4_],2,pfVar7);
      pCVar3 = _wd_local;
      ((wr_t *)&pwx)->d[status._4_4_] = fVar8;
      iVar5 = float64_is_zero(((wr_t *)&pwx)->d[status._4_4_]);
      local_89 = false;
      if (iVar5 == 0) {
        iVar5 = float64_is_zero_or_denormal(((wr_t *)&pwx)->d[status._4_4_]);
        local_89 = iVar5 != 0;
      }
      iVar5 = update_msacsr(pCVar3,0,(uint)local_89);
      iVar6 = get_enabled_exceptions(_wd_local,iVar5);
      if (iVar6 != 0) {
        fVar8 = float64_default_nan_mips64(pfVar7);
        ((wr_t *)&pwx)->d[status._4_4_] =
             (fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar5;
      }
    }
  }
  check_msacsr_cause(_wd_local,unaff_retaddr);
  msa_move_v(pwd_00,(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_fmsub_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_MULADD(pwx->w[i], pwd->w[i],
                           pws->w[i], pwt->w[i],
                           float_muladd_negate_product, 32);
      }
      break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_MULADD(pwx->d[i], pwd->d[i],
                           pws->d[i], pwt->d[i],
                           float_muladd_negate_product, 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}